

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Assimp::FBX::PropertyGet<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,FBX *this,PropertyTable *in,string *name,bool *result,bool useTemplate)

{
  PropertyTable *this_00;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tprop;
  PropertyTable *templ;
  Property *prop;
  bool useTemplate_local;
  bool *result_local;
  string *name_local;
  PropertyTable *in_local;
  
  templ = (PropertyTable *)PropertyTable::Get((PropertyTable *)this,(string *)in);
  if (templ == (PropertyTable *)0x0) {
    if (((ulong)result & 1) == 0) {
      name->_M_dataplus = (_Alloc_hider)0x0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    this_00 = PropertyTable::TemplateProps((PropertyTable *)this);
    if (this_00 == (PropertyTable *)0x0) {
      name->_M_dataplus = (_Alloc_hider)0x0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    templ = (PropertyTable *)PropertyTable::Get(this_00,(string *)in);
    if (templ == (PropertyTable *)0x0) {
      name->_M_dataplus = (_Alloc_hider)0x0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  this_01 = Property::As<Assimp::FBX::TypedProperty<std::__cxx11::string>>((Property *)templ);
  if (this_01 ==
      (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    name->_M_dataplus = (_Alloc_hider)0x0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    name->_M_dataplus = (_Alloc_hider)0x1;
    pbVar1 = TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Value(this_01);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, bool& result, bool useTemplate=false ) {
    const Property* prop = in.Get(name);
    if( nullptr == prop) {
        if ( ! useTemplate ) {
            result = false;
            return T();
        }
        const PropertyTable* templ = in.TemplateProps();
        if ( nullptr == templ ) {
            result = false;
            return T();
        }
        prop = templ->Get(name);
        if ( nullptr == prop ) {
            result = false;
            return T();
        }
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        result = false;
        return T();
    }

    result = true;
    return tprop->Value();
}